

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

int speak_pa_callback(void *inputBuffer,void *outputBuffer,unsigned_long framesPerBuffer,
                     PaStreamCallbackTimeInfo *timeInfo,PaStreamCallbackFlags statusFlags,
                     void *userData)

{
  long lVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = 2;
  if ((((userData != (void *)0x0) && (lVar1 = *userData, lVar1 != 0)) &&
      (*(char *)((long)userData + 0x20) == '\0')) && (*(char *)((long)userData + 0x21) == '\0')) {
    lVar2 = *(long *)((long)userData + 0x10);
    iVar3 = 1;
    if ((ulong)(lVar2 << 10) < *(ulong *)((long)userData + 8)) {
      lVar4 = 0;
      do {
        *(undefined2 *)((long)outputBuffer + lVar4 * 2) =
             *(undefined2 *)(lVar1 + lVar2 * 0x800 + lVar4 * 2);
        lVar4 = lVar4 + 1;
      } while ((int)lVar4 != 0x400);
      *(long *)((long)userData + 0x10) = lVar2 + 1;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

static int speak_pa_callback(
	const void *inputBuffer,
	void *outputBuffer,
	unsigned long framesPerBuffer,
	const PaStreamCallbackTimeInfo *timeInfo,
	PaStreamCallbackFlags statusFlags,
	void *userData)
{
	SpeakData *data = (SpeakData *)userData;
	if (data == NULL)
	{
		return paAbort;
	}

	if (data->data == NULL)
	{
		return paAbort;
	}

	if (data->stop || data->pause)
	{
		return paAbort;
	}

	if (data->counter * OPENJTALK_BLOCKSIZE >= data->length)
	{
		return paComplete;
	}

	short *p = (short *)outputBuffer;
	short *s = (short *)data->data + OPENJTALK_BLOCKSIZE * data->counter;
	for (int i = 0; i < OPENJTALK_BLOCKSIZE; i++)
	{
		*p++ = *s++;
		if (data->stop || data->pause)
		{
			return paAbort;
		}
	}
	data->counter++;
	return paContinue;
}